

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vec3f pos,Vec3f center,Vec3f up,float fovy,float aspect)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  float fVar23;
  
  auVar21._4_60_ = up._12_60_;
  auVar21._0_4_ = up.z;
  auVar20._8_56_ = up._8_56_;
  auVar20._0_8_ = up._0_8_;
  auVar17._8_56_ = center._8_56_;
  auVar17._0_8_ = center._0_8_;
  auVar12._8_56_ = pos._8_56_;
  auVar12._0_8_ = pos._0_8_;
  uVar1 = vmovlps_avx(auVar12._0_16_);
  (this->pos).x = (float)(int)uVar1;
  (this->pos).y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar11 = vsubps_avx(auVar17._0_16_,auVar12._0_16_);
  (this->pos).z = pos.z;
  fVar8 = center.z - pos.z;
  fVar22 = auVar11._0_4_;
  auVar16._0_4_ = fVar22 * fVar22;
  fVar2 = auVar11._4_4_;
  auVar16._4_4_ = fVar2 * fVar2;
  fVar14 = auVar11._8_4_;
  auVar16._8_4_ = fVar14 * fVar14;
  fVar15 = auVar11._12_4_;
  auVar16._12_4_ = fVar15 * fVar15;
  auVar16 = vmovshdup_avx(auVar16);
  auVar16 = vfmadd231ss_fma(auVar16,auVar11,auVar11);
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar13 = 1.0 / auVar16._0_4_;
  fVar8 = fVar8 * fVar13;
  auVar11._0_4_ = fVar22 * fVar13;
  auVar11._4_4_ = fVar2 * fVar13;
  auVar11._8_4_ = fVar14 * fVar13;
  auVar11._12_4_ = fVar15 * fVar13;
  auVar16 = vmovshdup_avx(auVar11);
  uVar1 = vmovlps_avx(auVar11);
  (this->dir).x = (float)(int)uVar1;
  (this->dir).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dir).z = fVar8;
  auVar19 = auVar20._0_16_;
  uVar1 = vmovlps_avx(auVar19);
  (this->up).x = (float)(int)uVar1;
  (this->up).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->up).z = auVar21._0_4_;
  fVar14 = auVar16._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar11,auVar11);
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar22 = 1.0 / auVar16._0_4_;
  fVar2 = auVar11._0_4_ * fVar22;
  fVar14 = fVar14 * fVar22;
  fVar8 = fVar8 * fVar22;
  auVar16 = vmovshdup_avx(auVar19);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * auVar21._0_4_)),ZEXT416((uint)fVar8),auVar19);
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(auVar16._0_4_ * fVar8)),ZEXT416((uint)fVar14),
                            auVar21._0_16_);
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * up.x)),ZEXT416((uint)fVar2),auVar16);
  fVar15 = auVar11._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar19,auVar19);
  auVar16 = vfmadd231ss_fma(auVar16,auVar9,auVar9);
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar10 = 1.0 / auVar16._0_4_;
  fVar15 = fVar15 * fVar10;
  fVar13 = auVar19._0_4_ * fVar10;
  fVar10 = auVar9._0_4_ * fVar10;
  auVar11 = vfnmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar10)),ZEXT416((uint)fVar15),
                             ZEXT416((uint)fVar8));
  auVar16 = vfnmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar8)),ZEXT416((uint)fVar10),
                             ZEXT416((uint)fVar2));
  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar15)),ZEXT416((uint)fVar13),
                             ZEXT416((uint)fVar14));
  fVar23 = auVar16._0_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar11,auVar11);
  auVar16 = vfmadd231ss_fma(auVar16,auVar19,auVar19);
  auVar16 = vsqrtss_avx(auVar16,auVar16);
  fVar18 = 1.0 / auVar16._0_4_;
  fVar3 = auVar11._0_4_ * fVar18;
  fVar4 = auVar19._0_4_ * fVar18;
  fVar22 = sinf(fovy * 0.5 * 0.017453292);
  fVar22 = fVar22 + fVar22;
  fVar5 = fVar22 * aspect;
  fVar6 = fVar5 * 0.5;
  fVar7 = fVar22 * 0.5;
  auVar16 = vinsertps_avx(ZEXT416((uint)((fVar6 * fVar13 + fVar2) - fVar3 * fVar7)),
                          ZEXT416((uint)((fVar6 * fVar15 + fVar14) - fVar23 * fVar18 * fVar7)),0x10)
  ;
  uVar1 = vmovlps_avx(auVar16);
  (this->dir_top_left).x = (float)(int)uVar1;
  (this->dir_top_left).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dir_top_left).z = (fVar6 * fVar10 + fVar8) - fVar4 * fVar7;
  auVar16 = vinsertps_avx(ZEXT416((uint)(fVar5 * -fVar13)),ZEXT416((uint)(fVar5 * -fVar15)),0x10);
  uVar1 = vmovlps_avx(auVar16);
  (this->screen_du).x = (float)(int)uVar1;
  (this->screen_du).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->screen_du).z = fVar5 * -fVar10;
  auVar16 = vinsertps_avx(ZEXT416((uint)(fVar3 * fVar22)),ZEXT416((uint)(fVar23 * fVar18 * fVar22)),
                          0x10);
  uVar1 = vmovlps_avx(auVar16);
  (this->screen_dv).x = (float)(int)uVar1;
  (this->screen_dv).y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->screen_dv).z = fVar4 * fVar22;
  return;
}

Assistant:

PerspectiveCamera::PerspectiveCamera(Vec3f pos, Vec3f center, Vec3f up, float fovy, float aspect)
	: pos(pos), dir((center - pos).normalized()), up(up)
{
	Vec3f dz = dir.normalized();
	Vec3f dx = -dz.cross(up).normalized();
	Vec3f dy = dx.cross(dz).normalized();
	float dim_y = 2.f * std::sin((fovy / 2.f) * (static_cast<float>(M_PI) / 180.f));
	float dim_x = dim_y * aspect;
	dir_top_left = dz - 0.5f * dim_x * dx - 0.5f * dim_y * dy;
	screen_du = dx * dim_x;
	screen_dv = dy * dim_y;
}